

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_type.hpp
# Opt level: O1

void __thiscall
ExchCXX::detail::BuiltinKernelImpl<ExchCXX::BuiltinSCAN_C,void>::
eval_exc_<int&,double_const*&,double_const*&,double_const*&,double_const*&,double*&>
          (BuiltinKernelImpl<ExchCXX::BuiltinSCAN_C,void> *this,int *args,double **args_1,
          double **args_2,double **args_3,double **args_4,double **args_5)

{
  double *eps;
  double rho;
  uint N;
  const_host_buffer_type rho_00;
  const_host_buffer_type sigma;
  const_host_buffer_type tau;
  host_buffer_type eps_00;
  long lVar1;
  double dVar2;
  double dVar3;
  double tau_00;
  
  N = *args;
  rho_00 = *args_1;
  sigma = *args_2;
  tau = *args_4;
  eps_00 = *args_5;
  if (*(int *)(this + 8) != 0) {
    if (0 < (int)N) {
      lVar1 = 0;
      do {
        rho = *(double *)((long)rho_00 + lVar1);
        eps = (double *)((long)eps_00 + lVar1);
        if (rho <= 1e-15) {
          *eps = 0.0;
        }
        else {
          dVar2 = *(double *)((long)sigma + lVar1);
          dVar3 = 1.0000000000000052e-40;
          if (1.0000000000000052e-40 <= dVar2) {
            dVar3 = dVar2;
          }
          dVar2 = *(double *)((long)tau + lVar1);
          tau_00 = 1e-20;
          if (1e-20 <= dVar2) {
            tau_00 = dVar2;
          }
          dVar2 = rho * 8.0 * tau_00;
          if (dVar3 <= dVar2) {
            dVar2 = dVar3;
          }
          kernel_traits<ExchCXX::BuiltinSCAN_C>::eval_exc_unpolar_impl(rho,dVar2,0.0,tau_00,eps);
        }
        lVar1 = lVar1 + 8;
      } while ((ulong)N << 3 != lVar1);
    }
    return;
  }
  host_eval_exc_helper_polar<ExchCXX::BuiltinSCAN_C>(N,rho_00,sigma,*args_3,tau,eps_00);
  return;
}

Assistant:

void eval_exc_(Args&&... args) const {
    if( is_polarized() )
      host_eval_exc_helper_polar<KernelType>(
        std::forward<Args>(args)...
      );
    else
      host_eval_exc_helper_unpolar<KernelType>(
        std::forward<Args>(args)...
      );
  }